

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifsdm(bifcxdef *ctx,int argc)

{
  objnum func;
  runcxdef *prVar1;
  runsdef *prVar2;
  voccxdef *ctx_00;
  runsdef val;
  runsdef local_18;
  
  prVar1 = ctx->bifcxrun;
  prVar2 = prVar1->runcxsp;
  ctx_00 = prVar1->runcxvoc;
  prVar1->runcxsp = prVar2 + -1;
  prVar1 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\n') {
    prVar1->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f3);
  }
  prVar2 = prVar1->runcxsp;
  func = (prVar2->runsv).runsvobj;
  prVar1->runcxsp = prVar2 + -1;
  local_18.runstyp = prVar2[-1].runstyp;
  local_18._1_7_ = *(undefined7 *)&prVar2[-1].field_0x1;
  local_18.runsv = prVar2[-1].runsv;
  if ((local_18.runstyp & 0xfb) != 3) {
    vocsetfd(ctx_00,ctx_00->voccxdmn,func,0,0,&local_18,0x406);
    return;
  }
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x403);
}

Assistant:

void bifsdm(bifcxdef *ctx, int argc)
{
    objnum    func;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);            /* check for proper argument count */
    func = runpopfn(ctx->bifcxrun);
    runpop(ctx->bifcxrun, &val);
    
    /* limitation:  don't allow string or list for value */
    if (val.runstyp == DAT_LIST || val.runstyp == DAT_SSTRING)
        runsig(ctx->bifcxrun, ERR_FUSEVAL);
    
    vocsetfd(voc, voc->voccxdmn, func, (prpnum)0, 0,
             &val, ERR_MANYDMN);
}